

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3::StringtoInt::ByteSizeLong(StringtoInt *this)

{
  bool bVar1;
  int size;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *this_00
  ;
  reference key;
  size_t sVar2;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  StringtoInt *this_;
  StringtoInt *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  size = _internal_map_size(this);
  sStack_58 = google::protobuf::internal::FromIntSize(size);
  this_00 = _internal_map_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::begin
            ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,this_00);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::end
            ((const_iterator *)&entry,this_00);
  while( true ) {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&entry);
    if (!bVar1) break;
    key = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::const_iterator::operator*
                    ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)5>
            ::ByteSizeLong(&key->first,&key->second);
    sStack_58 = sVar2 + sStack_58;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
    const_iterator::operator++((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t StringtoInt::ByteSizeLong() const {
  const StringtoInt& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.StringtoInt)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<string, int32> map = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_size());
      for (const auto& entry : this_._internal_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, ::int32_t,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_INT32>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}